

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::~cmComputeLinkDepends(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *this_00;
  cmComputeLinkDepends *this_local;
  
  cmDeleteAll<std::vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>>
            (&this->InferredDependSets);
  this_00 = this->CCG;
  if (this_00 != (cmComputeComponentGraph *)0x0) {
    cmComputeComponentGraph::~cmComputeComponentGraph(this_00);
    operator_delete(this_00,0xd8);
  }
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::~set
            (&this->OldWrongConfigItems);
  std::vector<int,_std::allocator<int>_>::~vector(&this->OriginalEntries);
  std::vector<int,_std::allocator<int>_>::~vector(&this->FinalLinkOrder);
  std::
  map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::~map(&this->PendingComponents);
  std::vector<int,_std::allocator<int>_>::~vector(&this->ComponentOrder);
  std::vector<char,_std::allocator<char>_>::~vector(&this->ComponentVisited);
  cmGraphAdjacencyList::~cmGraphAdjacencyList(&this->EntryConstraintGraph);
  std::
  vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ::~vector(&this->InferredDependSets);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->SharedDepFollowed);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
  ::~queue(&this->SharedDepQueue);
  std::
  queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
  ::~queue(&this->BFSQueue);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->LinkEntryIndex);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->EntryList);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->FinalLinkEntries);
  std::__cxx11::string::~string((string *)&this->Config);
  return;
}

Assistant:

cmComputeLinkDepends::~cmComputeLinkDepends()
{
  cmDeleteAll(this->InferredDependSets);
  delete this->CCG;
}